

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O3

void binary_op_list(char *op,List *ls,int m68kop,ParsedOpcodeInfo *info,CCVariant *var)

{
  ParsedOpcodeInfo *extraout_RDX;
  ParsedOpcodeInfo *info_00;
  ParsedOpcodeInfo *extraout_RDX_00;
  FILE *pFVar1;
  
  pFVar1 = syn68k_c_stream;
  putc(0x28,(FILE *)syn68k_c_stream);
  info_00 = extraout_RDX;
  if (ls == (List *)0x0) {
    fputs("0 ",(FILE *)syn68k_c_stream);
  }
  else {
    do {
      generate_code_for_list(ls,(int)pFVar1,info_00,(CCVariant *)info);
      if (ls->cdr == (ListStruct *)0x0) break;
      pFVar1 = (FILE *)0x1132ba;
      fprintf((FILE *)syn68k_c_stream,"%s ",op);
      ls = ls->cdr;
      info_00 = extraout_RDX_00;
    } while (ls != (ListStruct *)0x0);
  }
  putc(0x29,(FILE *)syn68k_c_stream);
  return;
}

Assistant:

static void
binary_op_list (const char *op, List *ls, int m68kop,
		const ParsedOpcodeInfo *info, const CCVariant *var)
{
  putc ('(', syn68k_c_stream);

  /* Output something for empty list. */
  if (ls == NULL)
    fputs ("0 ", syn68k_c_stream);
  for (; ls != NULL; ls = ls->cdr)
    {
      generate_code_for_list (ls, m68kop, info, var);
      if (ls->cdr != NULL)
	fprintf (syn68k_c_stream, "%s ", op);
    }
  putc (')', syn68k_c_stream);
}